

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O1

bool_t xdr_uint16_t(XDR *__xdrs,uint16_t *__up)

{
  uint *puVar1;
  xdr_op xVar2;
  undefined4 uVar3;
  char cVar4;
  bool_t bVar5;
  undefined8 in_RAX;
  caddr_t pcVar6;
  ushort local_c [2];
  
  xVar2 = __xdrs[2].x_op;
  bVar5 = (bool_t)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (xVar2 == XDR_FREE) {
    return bVar5;
  }
  if (xVar2 == XDR_DECODE) {
    pcVar6 = (caddr_t)(*(undefined4 **)&__xdrs->x_handy + 1);
    if (__xdrs[1].x_private < pcVar6) {
      cVar4 = (*(code *)**(undefined8 **)__xdrs)(__xdrs,local_c);
      if (cVar4 == '\0') goto LAB_00116792;
      pcVar6 = (caddr_t)(ulong)local_c[0];
      *__up = local_c[0];
    }
    else {
      uVar3 = **(undefined4 **)&__xdrs->x_handy;
      *__up = (ushort)(byte)((uint)uVar3 >> 0x18) | (ushort)((uint)uVar3 >> 8) & 0xff00;
      *(caddr_t *)&__xdrs->x_handy = pcVar6;
    }
    bVar5 = (bool_t)CONCAT71((int7)((ulong)pcVar6 >> 8),1);
  }
  else {
    if (xVar2 == XDR_ENCODE) {
      puVar1 = *(uint **)&__xdrs->x_handy + 1;
      if (puVar1 <= __xdrs[1].x_base) {
        **(uint **)&__xdrs->x_handy = (*__up & 0xff00) << 8 | (uint)*__up << 0x18;
        *(uint **)&__xdrs->x_handy = puVar1;
        return bVar5;
      }
      bVar5 = (**(code **)(*(long *)__xdrs + 8))();
      return bVar5;
    }
LAB_00116792:
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

static inline bool
xdr_uint16_t(XDR *xdrs, uint16_t *u_int16_p)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (XDR_PUTUINT16(xdrs, *u_int16_p));

	case XDR_DECODE:
		return (XDR_GETUINT16(xdrs, u_int16_p));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}